

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

void __thiscall
leveldb::Version::GetOverlappingInputs
          (Version *this,int level,InternalKey *begin,InternalKey *end,
          vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *inputs)

{
  int iVar1;
  Comparator *pCVar2;
  InternalKey *pIVar3;
  reference ppFVar4;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  value_type *in_RDI;
  long in_FS_OFFSET;
  size_t i;
  Comparator *user_cmp;
  Slice file_limit;
  Slice file_start;
  FileMetaData *f;
  Slice user_end;
  Slice user_begin;
  Slice *in_stack_ffffffffffffff48;
  InternalKey *this_00;
  InternalKey *in_stack_ffffffffffffff58;
  InternalKey *pIVar5;
  Slice local_70;
  Slice local_60;
  value_type local_50;
  Slice local_48;
  Slice local_38;
  char *local_28;
  size_t local_20;
  char *local_18;
  size_t local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_ESI < 0) {
    __assert_fail("level >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                  ,0x1f6,
                  "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
                 );
  }
  if (in_ESI < 7) {
    std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::clear
              ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
               in_stack_ffffffffffffff48);
    Slice::Slice(in_stack_ffffffffffffff48);
    Slice::Slice(in_stack_ffffffffffffff48);
    if (in_RDX != 0) {
      local_38 = InternalKey::user_key(in_stack_ffffffffffffff58);
      local_18 = local_38.data_;
      local_10 = local_38.size_;
    }
    if (in_RCX != 0) {
      local_48 = InternalKey::user_key(in_stack_ffffffffffffff58);
      local_28 = local_48.data_;
      local_20 = local_48.size_;
    }
    pCVar2 = InternalKeyComparator::user_comparator
                       ((InternalKeyComparator *)in_stack_ffffffffffffff48);
    pIVar5 = (InternalKey *)0x0;
    while (this_00 = pIVar5, pIVar5 = this_00,
          pIVar3 = (InternalKey *)
                   std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                   size((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *
                        )this_00), this_00 < pIVar3) {
      pIVar5 = (InternalKey *)
               ((long)&(((_Vector_impl *)&(pIVar5->rep_)._M_dataplus)->super__Vector_impl_data).
                       _M_start + 1);
      ppFVar4 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)pIVar5,(size_type)in_RDI);
      local_50 = *ppFVar4;
      local_60 = InternalKey::user_key(pIVar5);
      local_70 = InternalKey::user_key(pIVar5);
      if ((((in_RDX == 0) ||
           (iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_70,&local_18), -1 < iVar1)) &&
          ((in_RCX == 0 ||
           (iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_60,&local_28), iVar1 < 1)))) &&
         (std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::push_back
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     pIVar5,in_RDI), in_ESI == 0)) {
        if ((in_RDX == 0) ||
           (iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_60,&local_18), -1 < iVar1)) {
          if ((in_RCX != 0) &&
             (iVar1 = (*pCVar2->_vptr_Comparator[2])(pCVar2,&local_70,&local_28), 0 < iVar1)) {
            local_28 = local_70.data_;
            local_20 = local_70.size_;
            std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::clear
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       this_00);
            pIVar5 = (InternalKey *)0x0;
          }
        }
        else {
          local_18 = local_60.data_;
          local_10 = local_60.size_;
          std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::clear
                    ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                     this_00);
          pIVar5 = (InternalKey *)0x0;
        }
      }
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
      __stack_chk_fail();
    }
    return;
  }
  __assert_fail("level < config::kNumLevels",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/leveldb/db/version_set.cc"
                ,0x1f7,
                "void leveldb::Version::GetOverlappingInputs(int, const InternalKey *, const InternalKey *, std::vector<FileMetaData *> *)"
               );
}

Assistant:

void Version::GetOverlappingInputs(int level, const InternalKey* begin,
                                   const InternalKey* end,
                                   std::vector<FileMetaData*>* inputs) {
  assert(level >= 0);
  assert(level < config::kNumLevels);
  inputs->clear();
  Slice user_begin, user_end;
  if (begin != nullptr) {
    user_begin = begin->user_key();
  }
  if (end != nullptr) {
    user_end = end->user_key();
  }
  const Comparator* user_cmp = vset_->icmp_.user_comparator();
  for (size_t i = 0; i < files_[level].size();) {
    FileMetaData* f = files_[level][i++];
    const Slice file_start = f->smallest.user_key();
    const Slice file_limit = f->largest.user_key();
    if (begin != nullptr && user_cmp->Compare(file_limit, user_begin) < 0) {
      // "f" is completely before specified range; skip it
    } else if (end != nullptr && user_cmp->Compare(file_start, user_end) > 0) {
      // "f" is completely after specified range; skip it
    } else {
      inputs->push_back(f);
      if (level == 0) {
        // Level-0 files may overlap each other.  So check if the newly
        // added file has expanded the range.  If so, restart search.
        if (begin != nullptr && user_cmp->Compare(file_start, user_begin) < 0) {
          user_begin = file_start;
          inputs->clear();
          i = 0;
        } else if (end != nullptr &&
                   user_cmp->Compare(file_limit, user_end) > 0) {
          user_end = file_limit;
          inputs->clear();
          i = 0;
        }
      }
    }
  }
}